

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_string(jit_State *J,RecordFFData *rd)

{
  CTState *cts_00;
  TRef TVar1;
  TRef TVar2;
  IRRef1 local_78;
  TRef local_74;
  TRef trlen;
  TRef tr;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  TVar2 = *J->base;
  if (TVar2 != 0) {
    if ((J->base[1] & 0x1f000000) == 0) {
      local_74 = crec_ct_tv(J,cts_00->tab + 0x13,0,TVar2,rd->argv);
      TVar2 = lj_ir_call(J,IRCALL_strlen,(ulong)local_74);
      local_78 = (IRRef1)TVar2;
    }
    else {
      TVar1 = crec_toint(J,cts_00,J->base[1],rd->argv + 1);
      local_78 = (IRRef1)TVar1;
      local_74 = crec_ct_tv(J,cts_00->tab + 0x12,0,TVar2,rd->argv);
    }
    (J->fold).ins.field_0.ot = 0x5004;
    (J->fold).ins.field_0.op1 = (IRRef1)local_74;
    (J->fold).ins.field_0.op2 = local_78;
    TVar2 = lj_opt_fold(J);
    *J->base = TVar2;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_string(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = J->base[0];
  if (tr) {
    TRef trlen = J->base[1];
    if (!tref_isnil(trlen)) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, tr, &rd->argv[0]);
    } else {
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CCHAR), 0, tr, &rd->argv[0]);
      trlen = lj_ir_call(J, IRCALL_strlen, tr);
    }
    J->base[0] = emitir(IRT(IR_XSNEW, IRT_STR), tr, trlen);
  }  /* else: interpreter will throw. */
}